

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O2

shared_ptr<duckdb::ParquetKeys,_true>
duckdb::shared_ptr_cast<duckdb::ObjectCacheEntry,duckdb::ParquetKeys>
          (shared_ptr<duckdb::ObjectCacheEntry,_true> *src)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::ParquetKeys,_true> sVar1;
  __shared_ptr<duckdb::ParquetKeys,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  ::std::static_pointer_cast<duckdb::ParquetKeys,duckdb::ObjectCacheEntry>
            ((shared_ptr<duckdb::ObjectCacheEntry> *)&local_20);
  ::std::__shared_ptr<duckdb::ParquetKeys,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<duckdb::ParquetKeys,_(__gnu_cxx::_Lock_policy)2> *)src,&local_20);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  sVar1.internal.super___shared_ptr<duckdb::ParquetKeys,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.internal.super___shared_ptr<duckdb::ParquetKeys,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)src;
  return (shared_ptr<duckdb::ParquetKeys,_true>)
         sVar1.internal.super___shared_ptr<duckdb::ParquetKeys,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<TGT> shared_ptr_cast(shared_ptr<SRC> src) { // NOLINT: mimic std style
	return shared_ptr<TGT>(std::static_pointer_cast<TGT, SRC>(src.internal));
}